

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_utils.hpp
# Opt level: O1

int parse_utils::parse_memory(string *memory)

{
  pointer pcVar1;
  ostream *poVar2;
  long lVar3;
  int iVar4;
  long *local_50;
  long local_48;
  long local_40 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((memory->_M_dataplus)._M_p[memory->_M_string_length - 1] == 'm') {
    std::__cxx11::string::pop_back();
    pcVar1 = (memory->_M_dataplus)._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + memory->_M_string_length);
    if (local_48 == 0) {
      iVar4 = 0;
    }
    else {
      lVar3 = 0;
      iVar4 = 0;
      do {
        iVar4 = (int)*(char *)((long)local_50 + lVar3) + iVar4 * 10 + -0x30;
        lVar3 = lVar3 + 1;
      } while (local_48 != lVar3);
      iVar4 = iVar4 * 0x100000;
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    return iVar4;
  }
  std::operator+(&local_30,"error flag memory: ",memory);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_30);
  poVar2 = std::operator<<((ostream *)&std::cerr,"please use flag \'--memory 10m\' ");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(-1);
}

Assistant:

static int parse_memory(std::string memory) {
    if (memory.back() != 'm') {
      std::cerr << "error flag memory: " + memory << std::endl;
      std::cerr << "please use flag '--memory 10m' " << std::endl;
      exit(-1);
    }
    memory.pop_back();
    return obj_utils::string_to_int(memory) << 20;
  }